

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>::
find<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::ReadableDirectory_const*&>
          (HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks> *this,
          ArrayPtr<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> table,
          ReadableDirectory **params)

{
  int iVar1;
  ArrayDisposer *pAVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  uint hash;
  Entry *pEVar7;
  long *in_R8;
  Maybe<unsigned_long> MVar8;
  
  pEVar7 = table.ptr;
  pAVar2 = (pEVar7->value).content.disposer;
  aVar6.value = table.size_;
  if (pAVar2 != (ArrayDisposer *)0x0) {
    hash = (uint)((int)((ulong)*in_R8 >> 0x20) * 0xbfe3 + (int)*in_R8 != 0);
    uVar4 = kj::_::chooseBucket(hash,(uint)pAVar2);
    sVar3 = (pEVar7->value).content.size_;
    aVar6 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            (pEVar7->value).content.disposer;
    while( true ) {
      uVar5 = (ulong)uVar4;
      iVar1 = *(int *)(sVar3 + 4 + uVar5 * 8);
      if (iVar1 == 0) break;
      if (((iVar1 != 1) && (*(uint *)(sVar3 + uVar5 * 8) == hash)) &&
         (((ArrayDisposer *)(table.size_ + (ulong)(iVar1 - 2) * 0x20))->_vptr_ArrayDisposer ==
          (_func_int **)*in_R8)) {
        *this = (HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>)0x1;
        *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
        goto LAB_001dd56e;
      }
      uVar4 = (uint)(ArrayDisposer *)(uVar5 + 1);
      if ((ArrayDisposer *)(uVar5 + 1) == (ArrayDisposer *)aVar6.value) {
        uVar4 = 0;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>)0x0;
LAB_001dd56e:
  MVar8.ptr.field_1.value = aVar6.value;
  MVar8.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar8.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }